

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::cert_compression_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  CertCompressionAlg *pCVar4;
  bool local_b1;
  CertCompressionAlg *alg;
  CertCompressionAlg *__end1;
  CertCompressionAlg *__begin1;
  Vector<bssl::CertCompressionAlg> *__range1;
  CBB algs;
  CBB contents;
  bool first;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = true;
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&hs->ssl->ctx);
  __end1 = Vector<bssl::CertCompressionAlg>::begin(&psVar3->cert_compression_algs);
  pCVar4 = Vector<bssl::CertCompressionAlg>::end(&psVar3->cert_compression_algs);
  do {
    if (__end1 == pCVar4) {
      local_b1 = true;
      if (!bVar1) {
        iVar2 = CBB_flush(out_compressible);
        local_b1 = iVar2 != 0;
      }
      return local_b1;
    }
    if (__end1->decompress != (ssl_cert_decompression_func_t)0x0) {
      if ((bVar1) &&
         (((iVar2 = CBB_add_u16(out_compressible,0x1b), iVar2 == 0 ||
           (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&algs.u + 0x18)),
           iVar2 == 0)) ||
          (iVar2 = CBB_add_u8_length_prefixed((CBB *)((long)&algs.u + 0x18),(CBB *)&__range1),
          iVar2 == 0)))) {
        return false;
      }
      bVar1 = false;
      iVar2 = CBB_add_u16((CBB *)&__range1,__end1->alg_id);
      if (iVar2 == 0) {
        return false;
      }
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static bool cert_compression_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                             CBB *out_compressible,
                                             ssl_client_hello_type_t type) {
  bool first = true;
  CBB contents, algs;

  for (const auto &alg : hs->ssl->ctx->cert_compression_algs) {
    if (alg.decompress == nullptr) {
      continue;
    }

    if (first &&
        (!CBB_add_u16(out_compressible, TLSEXT_TYPE_cert_compression) ||
         !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
         !CBB_add_u8_length_prefixed(&contents, &algs))) {
      return false;
    }
    first = false;
    if (!CBB_add_u16(&algs, alg.alg_id)) {
      return false;
    }
  }

  return first || CBB_flush(out_compressible);
}